

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[75],kj::Exception&>
          (String *__return_storage_ptr__,kj *this,char (*params) [75],Exception *params_1)

{
  char (*value) [75];
  kj *this_00;
  Exception *value_00;
  String local_48;
  ArrayPtr<const_char> local_30;
  Exception *local_20;
  Exception *params_local_1;
  char (*params_local) [75];
  
  local_20 = (Exception *)params;
  params_local_1 = (Exception *)this;
  params_local = (char (*) [75])__return_storage_ptr__;
  value = ::const((char (*) [75])this);
  local_30 = toCharSequence<char_const(&)[75]>(value);
  this_00 = (kj *)fwd<kj::Exception&>(local_20);
  toCharSequence<kj::Exception&>(&local_48,this_00,value_00);
  _::concat<kj::ArrayPtr<char_const>,kj::String>
            (__return_storage_ptr__,(_ *)&local_30,(ArrayPtr<const_char> *)&local_48,
             &params_1->ownFile);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}